

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.hpp
# Opt level: O2

Oop __thiscall Lodtalk::MethodDictionary::internalAtOrNil(MethodDictionary *this,Oop key)

{
  ptrdiff_t pVar1;
  Oop *pOVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar3;
  
  pVar1 = HashedCollection::
          findKeyPosition<Lodtalk::Oop(Lodtalk::Oop_const&),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
                    ((HashedCollection *)this,key,identityFunction<Lodtalk::Oop>,identityHashOf,
                     identityOopEquals);
  if (pVar1 < 0) {
    aVar3.pointer = (uint8_t *)&NilObject;
  }
  else {
    pOVar2 = getHashTableKeys(this);
    aVar3.pointer = (uint8_t *)&NilObject;
    if (pOVar2[pVar1].field_0.pointer != (uint8_t *)&NilObject) {
      pOVar2 = getHashTableValues(this);
      aVar3 = (anon_union_8_4_0eb573b0_for_Oop_0)pOVar2[pVar1].field_0.pointer;
    }
  }
  return (Oop)aVar3.pointer;
}

Assistant:

Oop internalAtOrNil(Oop key)
	{
		// If a slot was not found, try to increase the capacity.
		auto position = findKeyPosition(key, identityFunction<Oop>, identityHashOf, identityOopEquals);
		if(position < 0)
			return nilOop();

		auto oldKey = getHashTableKeys()[position];
		if(isNil(oldKey))
			return nilOop();
		return getHashTableValues()[position];
	}